

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall
tcu::ThreadUtil::DataBlock::DataBlock(DataBlock *this,SharedPtr<tcu::ThreadUtil::Event> *event)

{
  SharedPtr<tcu::ThreadUtil::Event> local_18;
  
  local_18.m_ptr = event->m_ptr;
  local_18.m_state = event->m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::Object(&this->super_Object,"DataBlock",&local_18);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_18);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__DataBlock_01e7cdd8;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DataBlock::DataBlock (SharedPtr<Event> event)
	: Object("DataBlock", event)
{
}